

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

string * CLI::detail::remove_underscore(string *__return_storage_ptr__,string *str)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  undefined1 local_11;
  
  _Var1._M_current = (str->_M_dataplus)._M_p;
  _Var1 = ::std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var1,_Var1._M_current + str->_M_string_length,
                     (_Iter_equals_val<const_char>)&local_11);
  ::std::__cxx11::string::erase
            (str,_Var1._M_current,(str->_M_dataplus)._M_p + str->_M_string_length);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline std::string remove_underscore(std::string str) {
    str.erase(std::remove(std::begin(str), std::end(str), '_'), std::end(str));
    return str;
}